

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

void Abc_SuppReadMinTest(char *pFileName)

{
  uint uVar1;
  Vec_Wrd_t *p;
  abctime aVar2;
  abctime aVar3;
  abctime time;
  int nVars;
  Vec_Wrd_t *vCubes;
  Vec_Wrd_t *vPairs;
  int local_2c;
  Vec_Wrd_t *local_28;
  Vec_Wrd_t *local_20;
  
  Abc_Clock();
  local_28 = Abc_SuppReadMin(pFileName,&local_2c);
  if (local_28 != (Vec_Wrd_t *)0x0) {
    p = Abc_SuppDiffMatrix(local_28);
    local_20 = p;
    Vec_WrdFreeP(&local_28);
    aVar2 = Abc_Clock();
    uVar1 = Abc_SuppSolve(p,local_2c);
    printf("Solution with %d variables found.  ",(ulong)uVar1);
    aVar3 = Abc_Clock();
    Abc_PrintTime(0x7f9870,(char *)(aVar3 - aVar2),time);
    Vec_WrdFreeP(&local_20);
  }
  return;
}

Assistant:

void Abc_SuppReadMinTest( char * pFileName )
{
//    int fVerbose = 0;
    abctime clk = Abc_Clock();
//    word Matrix[64];
    int nVars, nVarsMin;
    Vec_Wrd_t * vPairs, * vCubes;
    vCubes = Abc_SuppReadMin( pFileName, &nVars );
    if ( vCubes == NULL )
        return;
    vPairs = Abc_SuppDiffMatrix( vCubes );
    Vec_WrdFreeP( &vCubes );
    // solve the problem
    clk = Abc_Clock();
//    nVarsMin = Abc_SuppMinimize( Matrix, vPairs, nVars, fVerbose );
    nVarsMin = Abc_SuppSolve( vPairs, nVars );
    printf( "Solution with %d variables found.  ", nVarsMin );
    Abc_PrintTime( 1, "Covering time", Abc_Clock() - clk );

    Vec_WrdFreeP( &vPairs );
}